

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

void tinyformat::detail::formatImpl(ostream *out,char *fmt,FormatArg *args,int numArgs)

{
  runtime_error *prVar1;
  char *pcVar2;
  int in_ECX;
  char *in_RSI;
  long *in_RDI;
  size_t iend;
  size_t i;
  string result;
  ostringstream tmpStream;
  FormatArg *arg;
  char *fmtEnd;
  int ntrunc;
  bool spacePadPositive;
  int argIndex;
  bool positionalMode;
  char origFill;
  fmtflags origFlags;
  streamsize origPrecision;
  streamsize origWidth;
  int *fmtEnd_00;
  int in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  ostream *in_stack_fffffffffffffdc8;
  FormatArg *in_stack_fffffffffffffdd0;
  FormatArg *in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  int *in_stack_fffffffffffffe68;
  bool *in_stack_fffffffffffffe70;
  bool *in_stack_fffffffffffffe78;
  ostream *in_stack_fffffffffffffe80;
  int *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe98;
  int local_3c;
  byte local_36;
  undefined1 local_35;
  fmtflags local_34;
  streamsize local_30;
  streamsize local_28;
  int local_1c;
  char *local_10;
  long *local_8;
  
  local_1c = in_ECX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_28 = std::ios_base::width((ios_base *)((long)in_RDI + *(long *)(*in_RDI + -0x18)));
  local_30 = std::ios_base::precision((ios_base *)((long)local_8 + *(long *)(*local_8 + -0x18)));
  local_34 = std::ios_base::flags((ios_base *)((long)local_8 + *(long *)(*local_8 + -0x18)));
  local_35 = std::ios::fill();
  local_36 = 0;
  local_3c = 0;
  while (local_10 = printFormatStringLiteral
                              (in_stack_fffffffffffffdc8,
                               (char *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0)
                              ), *local_10 != '\0') {
    fmtEnd_00 = &local_3c;
    in_stack_fffffffffffffdc0 = local_1c;
    pcVar2 = streamStateFromFormat
                       (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                        in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                        in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                        in_stack_fffffffffffffe90,in_stack_fffffffffffffe98);
    if (local_1c <= local_3c) {
      prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar1,"tinyformat: Too many conversion specifiers in format string");
      __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    FormatArg::format(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                      (char *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                      (char *)fmtEnd_00,0);
    local_10 = pcVar2;
    if ((local_36 & 1) == 0) {
      local_3c = local_3c + 1;
    }
  }
  if (((local_36 & 1) == 0) && (local_3c < local_1c)) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar1,"tinyformat: Not enough conversion specifiers in format string");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ios_base::width((ios_base *)((long)local_8 + *(long *)(*local_8 + -0x18)),local_28);
  std::ios_base::precision((ios_base *)((long)local_8 + *(long *)(*local_8 + -0x18)),local_30);
  std::ios_base::flags((ios_base *)((long)local_8 + *(long *)(*local_8 + -0x18)),local_34);
  std::ios::fill((char)local_8 + (char)*(undefined8 *)(*local_8 + -0x18));
  return;
}

Assistant:

inline void formatImpl(std::ostream& out, const char* fmt,
                       const detail::FormatArg* args,
                       int numArgs)
{
    // Saved stream state
    std::streamsize origWidth = out.width();
    std::streamsize origPrecision = out.precision();
    std::ios::fmtflags origFlags = out.flags();
    char origFill = out.fill();

    // "Positional mode" means all format specs should be of the form "%n$..."
    // with `n` an integer. We detect this in `streamStateFromFormat`.
    bool positionalMode = false;
    int argIndex = 0;
    while (true) {
        fmt = printFormatStringLiteral(out, fmt);
        if (*fmt == '\0') {
            if (!positionalMode && argIndex < numArgs) {
                TINYFORMAT_ERROR("tinyformat: Not enough conversion specifiers in format string");
            }
            break;
        }
        bool spacePadPositive = false;
        int ntrunc = -1;
        const char* fmtEnd = streamStateFromFormat(out, positionalMode, spacePadPositive, ntrunc, fmt,
                                                   args, argIndex, numArgs);
        // NB: argIndex may be incremented by reading variable width/precision
        // in `streamStateFromFormat`, so do the bounds check here.
        if (argIndex >= numArgs) {
            TINYFORMAT_ERROR("tinyformat: Too many conversion specifiers in format string");
            return;
        }
        const FormatArg& arg = args[argIndex];
        // Format the arg into the stream.
        if (!spacePadPositive) {
            arg.format(out, fmt, fmtEnd, ntrunc);
        }
        else {
            // The following is a special case with no direct correspondence
            // between stream formatting and the printf() behaviour.  Simulate
            // it crudely by formatting into a temporary string stream and
            // munging the resulting string.
            std::ostringstream tmpStream;
            tmpStream.copyfmt(out);
            tmpStream.setf(std::ios::showpos);
            arg.format(tmpStream, fmt, fmtEnd, ntrunc);
            std::string result = tmpStream.str(); // allocates... yuck.
            for (size_t i = 0, iend = result.size(); i < iend; ++i) {
                if (result[i] == '+')
                    result[i] = ' ';
            }
            out << result;
        }
        if (!positionalMode)
            ++argIndex;
        fmt = fmtEnd;
    }

    // Restore stream state
    out.width(origWidth);
    out.precision(origPrecision);
    out.flags(origFlags);
    out.fill(origFill);
}